

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall SmallVector_ElementAccess_Test::TestBody(SmallVector_ElementAccess_Test *this)

{
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  const_iterator __first2;
  char *message;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  pointer_based_iterator<int> local_b0;
  pointer_based_iterator<int> local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  array<int,_4UL> expected;
  size_t end;
  size_t index;
  undefined1 local_48 [4];
  int count;
  small_vector<int,_4UL> buffer;
  SmallVector_ElementAccess_Test *this_local;
  
  buffer.buffer_ = (int *)this;
  pstore::small_vector<int,_4UL>::small_vector((small_vector<int,_4UL> *)local_48,4);
  index._4_4_ = 0x2a;
  end = 0;
  sVar2 = pstore::small_vector<int,_4UL>::size((small_vector<int,_4UL> *)local_48);
  for (; end != sVar2; end = end + 1) {
    piVar3 = pstore::small_vector<int,_4UL>::operator[]((small_vector<int,_4UL> *)local_48,end);
    *piVar3 = index._4_4_;
    index._4_4_ = index._4_4_ + 1;
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2b0000002a;
  local_98.pos_ =
       (pointer)std::begin<pstore::small_vector<int,4ul>>((small_vector<int,_4UL> *)local_48);
  local_b0.pos_ =
       (pointer)std::end<pstore::small_vector<int,4ul>>((small_vector<int,_4UL> *)local_48);
  __first2 = std::begin<std::array<int,4ul>>((array<int,_4UL> *)&gtest_ar_.message_);
  local_89 = std::equal<pstore::pointer_based_iterator<int>,int_const*>(local_98,local_b0,__first2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_88,
               (AssertionResult *)
               "std::equal (std::begin (buffer), std::end (buffer), std::begin (expected))","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0xe3,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pstore::small_vector<int,_4UL>::~small_vector((small_vector<int,_4UL> *)local_48);
  return;
}

Assistant:

TEST (SmallVector, ElementAccess) {
    pstore::small_vector<int, 4> buffer (std::size_t{4});
    int count = 42;
    for (std::size_t index = 0, end = buffer.size (); index != end; ++index) {
        buffer[index] = count++;
    }

    std::array<int, 4> const expected{{42, 43, 44, 45}};
    EXPECT_TRUE (std::equal (std::begin (buffer), std::end (buffer), std::begin (expected)));
}